

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

void __thiscall
helics::InterfaceInfo::createPublication
          (InterfaceInfo *this,InterfaceHandle handle,string_view key,string_view type,
          string_view units,uint16_t flags)

{
  DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>
  *this_00;
  char *pcVar1;
  InterfaceHandle local_94;
  DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>
  *local_90;
  unique_lock<std::shared_mutex> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  GlobalHandle local_38;
  
  local_58._M_str = type._M_str;
  local_58._M_len = type._M_len;
  pcVar1 = key._M_str;
  local_90 = (DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>
              *)&this->publications;
  local_88._M_device = &(this->publications).m_mutex;
  local_88._M_owns = false;
  local_94.hid = handle.hid;
  local_48._M_len = key._M_len;
  local_48._M_str = pcVar1;
  std::unique_lock<std::shared_mutex>::lock(&local_88);
  this_00 = local_90;
  local_88._M_owns = true;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar1,pcVar1 + key._M_len);
  local_38.fed_id.gid = (this->global_id)._M_i.gid;
  local_38.handle.hid = local_94.hid;
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (this_00,&local_78,&local_94,&local_38,&local_48,&local_58,&units);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((flags & 4) != 0) {
    PublicationInfo::setProperty(*(PublicationInfo **)(*(long *)(local_90 + 8) + -8),0x18d,1);
  }
  if ((flags >> 8 & 1) != 0) {
    PublicationInfo::setProperty(*(PublicationInfo **)(*(long *)(local_90 + 8) + -8),0x192,1);
  }
  if ((flags & 1) != 0) {
    PublicationInfo::setProperty(*(PublicationInfo **)(*(long *)(local_90 + 8) + -8),0x19b,1);
  }
  if ((flags >> 0xc & 1) != 0) {
    PublicationInfo::setProperty(*(PublicationInfo **)(*(long *)(local_90 + 8) + -8),0x1c4,1);
  }
  if ((flags & 8) != 0) {
    PublicationInfo::setProperty(*(PublicationInfo **)(*(long *)(local_90 + 8) + -8),0x197,1);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_88);
  return;
}

Assistant:

void InterfaceInfo::createPublication(InterfaceHandle handle,
                                      std::string_view key,
                                      std::string_view type,
                                      std::string_view units,
                                      std::uint16_t flags)
{
    auto cpHandle = publications.lock();
    cpHandle->insert(std::string(key), handle, GlobalHandle{global_id, handle}, key, type, units);
    if (checkActionFlag(flags, required_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        cpHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, buffer_data_flag)) {
        cpHandle->back()->setProperty(defs::Options::BUFFER_DATA, 1);
    }
    if (checkActionFlag(flags, only_transmit_on_change_flag)) {
        cpHandle->back()->setProperty(defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE, 1);
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        cpHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
}